

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

StringTree * __thiscall
capnp::JsonCodec::Impl::encodeRaw
          (StringTree *__return_storage_ptr__,Impl *this,Reader value,uint indent,bool *multiline,
          bool hasPrefix)

{
  ushort uVar1;
  undefined8 uVar2;
  byte bVar3;
  undefined4 in_register_00000014;
  char (*params) [5];
  Array<kj::StringTree> *pAVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  StringPtr chars;
  bool childMultiline_1;
  undefined1 local_141;
  bool childMultiline;
  undefined1 local_139;
  uint subIndent;
  undefined1 auStack_134 [12];
  StringPtr colon;
  Fault f;
  Array<kj::StringTree> encodedElements;
  uint local_c0;
  Array<kj::StringTree> local_a8;
  Array<kj::StringTree> local_90;
  Array<kj::StringTree> local_78;
  Reader array;
  
  uVar2 = auStack_134._4_8_;
  params = (char (*) [5])CONCAT44(in_register_00000014,indent);
  if (value._reader.dataSize < 0x10) {
switchD_0022a6b4_caseD_0:
    kj::strTree<char_const(&)[5]>(__return_storage_ptr__,(kj *)"null",params);
    return __return_storage_ptr__;
  }
  uVar1 = *value._reader.data;
  if (6 < (ulong)uVar1) {
    array.reader.segment._0_4_ = (uint)uVar1;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,100,FAILED,(char *)0x0,
               "\"unknown JsonValue type\", static_cast<uint>(value.which())",
               (char (*) [23])"unknown JsonValue type",(uint *)&array);
    kj::_::Debug::Fault::fatal(&f);
  }
  params = (char (*) [5])
           ((long)&switchD_0022a6b4::switchdataD_0029db14 +
           (long)(int)(&switchD_0022a6b4::switchdataD_0029db14)[uVar1]);
  auStack_134._4_8_ = uVar2;
  switch(uVar1) {
  case 0:
    goto switchD_0022a6b4_caseD_0;
  case 1:
    if (value._reader.dataSize == 0x10) {
      bVar3 = 0;
    }
    else {
      bVar3 = *(byte *)((long)value._reader.data + 2) & 1;
    }
    f.exception._0_1_ = bVar3;
    kj::strTree<bool>(__return_storage_ptr__,(bool *)&f);
    break;
  case 2:
    uVar6 = 0;
    uVar7 = 0;
    if (0x7f < value._reader.dataSize) {
      uVar6 = (undefined4)*(undefined8 *)((long)value._reader.data + 8);
      uVar7 = (undefined4)((ulong)*(undefined8 *)((long)value._reader.data + 8) >> 0x20);
    }
    f.exception = (Exception *)CONCAT44(uVar7,uVar6);
    kj::strTree<double>(__return_storage_ptr__,(double *)&f);
    break;
  case 3:
    chars.content = (ArrayPtr<const_char>)json::Value::Reader::getString(&value);
    encodeString((String *)&f,this,chars);
    kj::strTree<kj::String>(__return_storage_ptr__,(String *)&f);
    kj::Array<char>::~Array((Array<char> *)&f);
    break;
  case 4:
    json::Value::Reader::getArray(&array,&value);
    subIndent = (indent + 1) - (uint)(array.reader.elementCount < 2);
    _childMultiline = _childMultiline & 0xffffff00;
    colon.content.ptr = (char *)&array;
    f.exception = (Exception *)this;
    kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:63:32)>
              (&encodedElements,
               (Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> *)&colon,
               (anon_class_24_3_b5b61ab8 *)&f);
    colon.content.ptr = (char *)CONCAT71(colon.content.ptr._1_7_,0x5b);
    local_78.ptr = encodedElements.ptr;
    local_78.size_ = encodedElements.size_;
    local_78.disposer = encodedElements.disposer;
    encodedElements.ptr = (StringTree *)0x0;
    encodedElements.size_ = 0;
    pcVar5 = (char *)(ulong)indent;
    encodeList((StringTree *)&f,this,&local_78,childMultiline,indent,multiline,hasPrefix);
    childMultiline_1 = true;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&colon,(char *)&f,(StringTree *)&childMultiline_1,pcVar5
              );
    kj::StringTree::~StringTree((StringTree *)&f);
    pAVar4 = &local_78;
    goto LAB_0022a8e7;
  case 5:
    json::Value::Reader::getObject((Reader *)&array,&value);
    _childMultiline = (indent + 1) - (uint)(array.reader.elementCount < 2);
    childMultiline_1 = false;
    colon.content.ptr = ":";
    if ((ulong)this->prettyPrint != 0) {
      colon.content.ptr = ": ";
    }
    colon.content.size_ = (ulong)this->prettyPrint | 2;
    _subIndent = (Reader *)&array;
    f.exception = (Exception *)this;
    kj::_::Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:76:32)>
              (&encodedElements,
               (Mapper<capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader_&> *)
               &subIndent,(anon_class_32_4_977eede9 *)&f);
    subIndent._0_1_ = 0x7b;
    local_90.ptr = encodedElements.ptr;
    local_90.size_ = encodedElements.size_;
    local_90.disposer = encodedElements.disposer;
    encodedElements.ptr = (StringTree *)0x0;
    encodedElements.size_ = 0;
    pcVar5 = (char *)(ulong)indent;
    encodeList((StringTree *)&f,this,&local_90,childMultiline_1,indent,multiline,hasPrefix);
    local_141 = 0x7d;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&subIndent,(char *)&f,(StringTree *)&local_141,pcVar5);
    kj::StringTree::~StringTree((StringTree *)&f);
    pAVar4 = &local_90;
LAB_0022a8e7:
    kj::Array<kj::StringTree>::~Array(pAVar4);
    pAVar4 = &encodedElements;
LAB_0022a9ea:
    kj::Array<kj::StringTree>::~Array(pAVar4);
    break;
  case 6:
    json::Value::Reader::getCall((Reader *)&array,&value);
    json::Value::Call::Reader::getParams((Reader *)&encodedElements,(Reader *)&array);
    _childMultiline = (indent + 1) - (uint)(local_c0 < 2);
    childMultiline_1 = false;
    _subIndent = &encodedElements;
    f.exception = (Exception *)this;
    kj::_::Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compat_json_c__:91:32)>
              ((Array<kj::StringTree> *)&colon,
               (Mapper<capnp::List<capnp::json::Value,_(capnp::Kind)3>::Reader_&> *)&subIndent,
               (anon_class_24_3_b5b61ab8 *)&f);
    _subIndent = (ArrayPtr<const_char>)json::Value::Call::Reader::getFunction((Reader *)&array);
    local_141 = 0x28;
    local_a8.ptr = (StringTree *)colon.content.ptr;
    local_a8.size_ = colon.content.size_;
    colon.content.ptr = (char *)0x0;
    colon.content.size_ = 0;
    encodeList((StringTree *)&f,this,&local_a8,childMultiline_1,indent,multiline,true);
    local_139 = 0x29;
    kj::strTree<capnp::Text::Reader,char,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&subIndent,(Reader *)&local_141,(char *)&f,
               (StringTree *)&local_139,multiline);
    kj::StringTree::~StringTree((StringTree *)&f);
    kj::Array<kj::StringTree>::~Array(&local_a8);
    pAVar4 = (Array<kj::StringTree> *)&colon;
    goto LAB_0022a9ea;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree encodeRaw(JsonValue::Reader value, uint indent, bool& multiline,
                           bool hasPrefix) const {
    switch (value.which()) {
      case JsonValue::NULL_:
        return kj::strTree("null");
      case JsonValue::BOOLEAN:
        return kj::strTree(value.getBoolean());
      case JsonValue::NUMBER:
        return kj::strTree(value.getNumber());

      case JsonValue::STRING:
        return kj::strTree(encodeString(value.getString()));

      case JsonValue::ARRAY: {
        auto array = value.getArray();
        uint subIndent = indent + (array.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, array) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree('[', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), ']');
      }

      case JsonValue::OBJECT: {
        auto object = value.getObject();
        uint subIndent = indent + (object.size() > 1);
        bool childMultiline = false;
        kj::StringPtr colon = prettyPrint ? ": " : ":";
        auto encodedElements = KJ_MAP(field, object) {
          return kj::strTree(
              encodeString(field.getName()), colon,
              encodeRaw(field.getValue(), subIndent, childMultiline, true));
        };

        return kj::strTree('{', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, hasPrefix), '}');
      }

      case JsonValue::CALL: {
        auto call = value.getCall();
        auto params = call.getParams();
        uint subIndent = indent + (params.size() > 1);
        bool childMultiline = false;
        auto encodedElements = KJ_MAP(element, params) {
          return encodeRaw(element, subIndent, childMultiline, false);
        };

        return kj::strTree(call.getFunction(), '(', encodeList(
            kj::mv(encodedElements), childMultiline, indent, multiline, true), ')');
      }
    }

    KJ_FAIL_ASSERT("unknown JsonValue type", static_cast<uint>(value.which()));
  }